

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B2A_adapter.h
# Opt level: O0

void __thiscall adapter::B2AAdapter::~B2AAdapter(B2AAdapter *this)

{
  B2AAdapter *this_local;
  
  (this->super_ASocket)._vptr_ASocket = (_func_int **)&PTR_charge_0019e6b8;
  std::shared_ptr<adapter::BPlug>::~shared_ptr(&this->pbplug_);
  ASocket::~ASocket(&this->super_ASocket);
  return;
}

Assistant:

B2AAdapter::~B2AAdapter() {}